

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator f;
  iterator l;
  bool bVar1;
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  long in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i_1;
  size_type old_count;
  int i;
  key_type *in_stack_fffffffffffffcb8;
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffcc0;
  AssertHelper *this_01;
  uint *in_stack_fffffffffffffcc8;
  unsigned_long *lhs;
  char *in_stack_fffffffffffffcd0;
  char *rhs_expression;
  HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffcd8;
  char *lhs_expression;
  int line;
  HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffce0;
  char *file;
  undefined8 in_stack_fffffffffffffce8;
  Type type;
  AssertHelper *in_stack_fffffffffffffcf0;
  AssertHelper *this_02;
  Message *in_stack_fffffffffffffd38;
  AssertHelper *in_stack_fffffffffffffd40;
  AssertionResult local_250 [2];
  size_type local_230;
  undefined4 local_224;
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffdf0;
  value_type *in_stack_fffffffffffffdf8;
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe08 [48];
  undefined1 auVar2 [32];
  undefined8 in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  nonempty_iterator in_stack_fffffffffffffe78;
  AssertHelper *local_180;
  undefined1 local_178 [80];
  undefined1 local_128 [8];
  AssertHelper *pAStack_120;
  unsigned_long *local_118;
  char *pcStack_110;
  char *local_108;
  char *pcStack_100;
  undefined8 local_f8;
  Type TStack_f4;
  AssertHelper *pAStack_f0;
  key_type local_c0;
  size_type local_b8;
  undefined4 local_ac;
  AssertionResult local_a8;
  int local_94;
  size_type local_90;
  value_type local_30;
  pair<int,_int> local_20;
  int local_18;
  int local_14;
  key_type local_10;
  
  local_10 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffcd8,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  for (local_14 = 10; local_14 < 2000; local_14 = local_14 + 1) {
    local_30 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject(in_stack_fffffffffffffce0,
                              (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
    local_20 = local_30.first;
    local_18 = local_30.second;
    google::
    BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  }
  local_90 = google::
             BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xeccf95);
  for (local_94 = 10; local_94 < 1000; local_94 = local_94 + 1) {
    local_ac = 1;
    local_c0 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffffcd8,(int)((ulong)in_stack_fffffffffffffcd0 >> 0x20)
                          );
    local_b8 = google::
               BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::erase(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              ((char *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8
               ,(unsigned_long *)in_stack_fffffffffffffcc0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffcf0);
      testing::AssertionResult::failure_message((AssertionResult *)0xecd06b);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffcf0,(Type)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                 (char *)in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                 in_stack_fffffffffffffcd0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffcc0);
      testing::Message::~Message((Message *)0xecd0ce);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xecd139);
  }
  this_00 = (BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 0x10);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(this_00);
  memcpy(local_128,local_178,0x48);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(this_00);
  memcpy(&stack0xfffffffffffffe40,&stack0xfffffffffffffdf0,0x48);
  f.pos.row_begin._M_current =
       (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffdf8;
  f.ht = (sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)in_stack_fffffffffffffdf0;
  f.pos.row_end._M_current =
       (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe00;
  auVar2 = in_stack_fffffffffffffe08._16_32_;
  f.pos.row_current._M_current =
       (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe08._0_8_;
  f.pos.col_current = (nonempty_iterator)in_stack_fffffffffffffe08._8_8_;
  f.end.row_begin._M_current =
       (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)auVar2._0_8_;
  f.end.row_end._M_current =
       (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)auVar2._8_8_;
  f.end.row_current._M_current =
       (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)auVar2._16_8_;
  f.end.col_current = (nonempty_iterator)auVar2._24_8_;
  l.pos.row_begin._M_current =
       (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe40;
  l.ht = (sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)in_stack_fffffffffffffe38;
  l.pos.row_end._M_current =
       (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe48;
  l.pos.row_current._M_current =
       (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe50;
  l.pos.col_current = (nonempty_iterator)in_stack_fffffffffffffe58;
  l.end.row_begin._M_current =
       (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe60;
  l.end.row_end._M_current =
       (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe68;
  l.end.row_current._M_current =
       (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_fffffffffffffe70;
  l.end.col_current = in_stack_fffffffffffffe78;
  type = TStack_f4;
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffde0,f,l);
  local_224 = 0;
  local_230 = google::
              BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xecd284);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (local_108,pcStack_110,(uint *)local_118,(unsigned_long *)pAStack_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffde0);
  this_01 = pAStack_120;
  lhs = local_118;
  rhs_expression = pcStack_110;
  lhs_expression = local_108;
  file = pcStack_100;
  this_02 = pAStack_f0;
  if (!bVar1) {
    testing::Message::Message((Message *)pAStack_f0);
    testing::AssertionResult::failure_message((AssertionResult *)0xecd2eb);
    testing::internal::AssertHelper::AssertHelper
              (pAStack_f0,type,pcStack_100,(int)((ulong)local_108 >> 0x20),pcStack_110);
    testing::internal::AssertHelper::operator=(local_180,(Message *)in_stack_fffffffffffffe78);
    testing::internal::AssertHelper::~AssertHelper(pAStack_120);
    testing::Message::~Message((Message *)0xecd34e);
    this_01 = pAStack_120;
    lhs = local_118;
    rhs_expression = pcStack_110;
    lhs_expression = local_108;
    file = pcStack_100;
    this_02 = pAStack_f0;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xecd3bc);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  *)0xecd3cd);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (lhs_expression,rhs_expression,lhs,(unsigned_long *)this_01);
  line = (int)((ulong)lhs_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_250);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    testing::AssertionResult::failure_message((AssertionResult *)0xecd446);
    testing::internal::AssertHelper::AssertHelper(this_02,type,file,line,rhs_expression);
    testing::internal::AssertHelper::operator=(local_180,(Message *)in_stack_fffffffffffffe78);
    testing::internal::AssertHelper::~AssertHelper(this_01);
    testing::Message::~Message((Message *)0xecd4a9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xecd514);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, EraseDoesNotResize) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  for (int i = 10; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  const typename TypeParam::size_type old_count = this->ht_.bucket_count();
  for (int i = 10; i < 1000; i++) {  // erase half one at a time
    EXPECT_EQ(1u, this->ht_.erase(this->UniqueKey(i)));
  }
  this->ht_.erase(this->ht_.begin(), this->ht_.end());  // and the rest at once
  EXPECT_EQ(0u, this->ht_.size());
  EXPECT_EQ(old_count, this->ht_.bucket_count());
}